

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestSlowShrinking.cpp
# Opt level: O2

int main(void)

{
  undefined4 in_stack_ffffffffffffff7c;
  SeedType in_stack_ffffffffffffff80;
  PropTestSlowFunction local_78;
  Result local_60;
  
  local_78.
  super_Property<std::vector<int,_std::allocator<int>_>,_cppqc::detail::null_type,_cppqc::detail::null_type,_cppqc::detail::null_type,_cppqc::detail::null_type>
  .super_PropertyBase._vptr_PropertyBase = (_func_int **)0x0;
  local_78.
  super_Property<std::vector<int,_std::allocator<int>_>,_cppqc::detail::null_type,_cppqc::detail::null_type,_cppqc::detail::null_type,_cppqc::detail::null_type>
  .m_gen.m_gen._M_t.
  super___uniq_ptr_impl<cppqc::detail::GenConcept<std::tuple<std::vector<int,_std::allocator<int>_>_>_>,_std::default_delete<cppqc::detail::GenConcept<std::tuple<std::vector<int,_std::allocator<int>_>_>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_cppqc::detail::GenConcept<std::tuple<std::vector<int,_std::allocator<int>_>_>_>_*,_std::default_delete<cppqc::detail::GenConcept<std::tuple<std::vector<int,_std::allocator<int>_>_>_>_>_>
  .
  super__Head_base<0UL,_cppqc::detail::GenConcept<std::tuple<std::vector<int,_std::allocator<int>_>_>_>_*,_false>
  ._M_head_impl =
       (unique_ptr<cppqc::detail::GenConcept<std::tuple<std::vector<int,_std::allocator<int>_>_>_>,_std::default_delete<cppqc::detail::GenConcept<std::tuple<std::vector<int,_std::allocator<int>_>_>_>_>_>
        )(__uniq_ptr_data<cppqc::detail::GenConcept<std::tuple<std::vector<int,_std::allocator<int>_>_>_>,_std::default_delete<cppqc::detail::GenConcept<std::tuple<std::vector<int,_std::allocator<int>_>_>_>_>,_true,_true>
          )0x0;
  local_78.shrinking._M_base._M_i = (__atomic_base<bool>)0x0;
  local_78._17_7_ = 0;
  PropTestSlowFunction::PropTestSlowFunction(&local_78);
  cppqc::
  quickCheckOutput<std::vector<int,std::allocator<int>>,cppqc::detail::null_type,cppqc::detail::null_type,cppqc::detail::null_type,cppqc::detail::null_type>
            (&local_60,(cppqc *)&local_78,
             (Property<std::vector<int,_std::allocator<int>_>,_cppqc::detail::null_type,_cppqc::detail::null_type,_cppqc::detail::null_type,_cppqc::detail::null_type>
              *)&std::cout,(ostream *)0x64,0,0,CONCAT44(in_stack_ffffffffffffff7c,0xffffffff),
             (duration<double,_std::ratio<1L,_1L>_>)0x403e000000000000,in_stack_ffffffffffffff80);
  std::
  _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(&local_60.labels._M_t);
  cppqc::
  Property<std::vector<int,_std::allocator<int>_>,_cppqc::detail::null_type,_cppqc::detail::null_type,_cppqc::detail::null_type,_cppqc::detail::null_type>
  ::~Property(&local_78.
               super_Property<std::vector<int,_std::allocator<int>_>,_cppqc::detail::null_type,_cppqc::detail::null_type,_cppqc::detail::null_type,_cppqc::detail::null_type>
             );
  return 0;
}

Assistant:

int main() {
  cppqc::quickCheckOutput(PropTestSlowFunction());
}